

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTestCaseBase.cpp
# Opt level: O1

string * __thiscall
glcts::TestCaseBase::getGLSLExtDirective_abi_cxx11_
          (string *__return_storage_ptr__,TestCaseBase *this,ExtensionType type,ExtensionName name,
          ExtensionBehavior behavior)

{
  ContextInfo *pCVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  char *__s;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var3;
  size_t sVar4;
  char *pcVar5;
  char *pcVar6;
  stringstream str;
  undefined8 *local_1b8 [2];
  undefined1 local_1a8 [376];
  
  if (type == EXTENSIONTYPE_NONE) {
    if ((name == EXTENSIONNAME_GEOMETRY_POINT_SIZE) ||
       (name == EXTENSIONNAME_TESSELLATION_POINT_SIZE)) goto LAB_00cf4968;
LAB_00cf4b2e:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar6 = "";
    pcVar5 = "";
  }
  else {
    if (name == EXTENSIONNAME_SHADER_IMAGE_ATOMIC) {
      type = EXTENSIONTYPE_OES;
    }
LAB_00cf4968:
    if (name == EXTENSIONNAME_TESSELLATION_POINT_SIZE) {
      local_1b8[0] = (undefined8 *)local_1a8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1b8,"GL_OES_tessellation_point_size","");
      pCVar1 = this->m_context->m_contextInfo;
      _Var3 = std::
              __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                        ((pCVar1->m_extensions).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         (pCVar1->m_extensions).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,local_1b8);
      pbVar2 = (pCVar1->m_extensions).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (local_1b8[0] != (undefined8 *)local_1a8) {
        operator_delete(local_1b8[0],local_1a8._0_8_ + 1);
      }
      type = EXTENSIONTYPE_OES;
      if (_Var3._M_current == pbVar2) {
        local_1b8[0] = (undefined8 *)local_1a8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1b8,"GL_EXT_tessellation_point_size","");
        pCVar1 = this->m_context->m_contextInfo;
        _Var3 = std::
                __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                          ((pCVar1->m_extensions).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                           (pCVar1->m_extensions).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,local_1b8);
        pbVar2 = (pCVar1->m_extensions).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (local_1b8[0] != (undefined8 *)local_1a8) {
          operator_delete(local_1b8[0],local_1a8._0_8_ + 1);
        }
        type = EXTENSIONTYPE_EXT;
        if (_Var3._M_current == pbVar2) goto LAB_00cf4b2e;
      }
    }
    if (name == EXTENSIONNAME_GEOMETRY_POINT_SIZE) {
      local_1b8[0] = (undefined8 *)local_1a8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1b8,"GL_OES_geometry_point_size","");
      pCVar1 = this->m_context->m_contextInfo;
      _Var3 = std::
              __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                        ((pCVar1->m_extensions).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         (pCVar1->m_extensions).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,local_1b8);
      pbVar2 = (pCVar1->m_extensions).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (local_1b8[0] != (undefined8 *)local_1a8) {
        operator_delete(local_1b8[0],local_1a8._0_8_ + 1);
      }
      type = EXTENSIONTYPE_OES;
      if (_Var3._M_current == pbVar2) {
        local_1b8[0] = (undefined8 *)local_1a8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1b8,"GL_EXT_geometry_point_size","");
        pCVar1 = this->m_context->m_contextInfo;
        _Var3 = std::
                __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                          ((pCVar1->m_extensions).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                           (pCVar1->m_extensions).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,local_1b8);
        pbVar2 = (pCVar1->m_extensions).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (local_1b8[0] != (undefined8 *)local_1a8) {
          operator_delete(local_1b8[0],local_1a8._0_8_ + 1);
        }
        type = EXTENSIONTYPE_EXT;
        if (_Var3._M_current == pbVar2) goto LAB_00cf4b2e;
      }
    }
    if (type == EXTENSIONTYPE_EXT) {
      pcVar6 = "EXT_";
    }
    else {
      if (type != EXTENSIONTYPE_OES) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar5 = "#error unknown extension type\n";
        pcVar6 = "";
        goto LAB_00cf4c66;
      }
      pcVar6 = "OES_";
    }
    if (name < (EXTENSIONNAME_GPU_SHADER5|EXTENSIONNAME_GEOMETRY_SHADER)) {
      if (behavior < 4) {
        pcVar5 = *(char **)(&DAT_02155798 + (ulong)name * 8);
        __s = *(char **)(&DAT_021557e8 + (ulong)behavior * 8);
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"#extension GL_",0xe);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar6,4);
        sVar4 = strlen(pcVar5);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar5,sVar4);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," : ",3);
        sVar4 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar4);
        std::__cxx11::stringbuf::str();
        std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
        std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
        return __return_storage_ptr__;
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar5 = "#error unknown extension behavior";
      pcVar6 = "";
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar5 = "#error unknown extension name\n";
      pcVar6 = "";
    }
  }
LAB_00cf4c66:
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar5,pcVar6);
  return __return_storage_ptr__;
}

Assistant:

std::string TestCaseBase::getGLSLExtDirective(ExtensionType type, ExtensionName name, ExtensionBehavior behavior)
{
	if (type == EXTENSIONTYPE_NONE && name != EXTENSIONNAME_GEOMETRY_POINT_SIZE &&
		name != EXTENSIONNAME_TESSELLATION_POINT_SIZE)
	{
		return "";
	}

	const char* type_str	 = NULL;
	const char* name_str	 = NULL;
	const char* behavior_str = NULL;

	if (name == EXTENSIONNAME_SHADER_IMAGE_ATOMIC)
	{
		// There is no EXT version of shader_image_atomic; use OES
		type = EXTENSIONTYPE_OES;
	}

	if (name == EXTENSIONNAME_TESSELLATION_POINT_SIZE)
	{
		// there is no core version of tessellation_point_size, use OES or EXT
		if (isExtensionSupported("GL_OES_tessellation_point_size"))
		{
			type = EXTENSIONTYPE_OES;
		}
		else if (isExtensionSupported("GL_EXT_tessellation_point_size"))
		{
			type = EXTENSIONTYPE_EXT;
		}
		else
		{
			return "";
		}
	}

	if (name == EXTENSIONNAME_GEOMETRY_POINT_SIZE)
	{
		// there is no core version of geometry_point_size, use OES or EXT
		if (isExtensionSupported("GL_OES_geometry_point_size"))
		{
			type = EXTENSIONTYPE_OES;
		}
		else if (isExtensionSupported("GL_EXT_geometry_point_size"))
		{
			type = EXTENSIONTYPE_EXT;
		}
		else
		{
			return "";
		}
	}

	switch (type)
	{
	case EXTENSIONTYPE_EXT:
		type_str = "EXT_";
		break;
	case EXTENSIONTYPE_OES:
		type_str = "OES_";
		break;
	default:
		DE_ASSERT(0);
		return "#error unknown extension type\n";
	}

	switch (name)
	{
	case EXTENSIONNAME_SHADER_IMAGE_ATOMIC:
		name_str = "shader_image_atomic";
		break;
	case EXTENSIONNAME_SHADER_IO_BLOCKS:
		name_str = "shader_io_blocks";
		break;
	case EXTENSIONNAME_GEOMETRY_SHADER:
		name_str = "geometry_shader";
		break;
	case EXTENSIONNAME_GEOMETRY_POINT_SIZE:
		name_str = "geometry_point_size";
		break;
	case EXTENSIONNAME_TESSELLATION_SHADER:
		name_str = "tessellation_shader";
		break;
	case EXTENSIONNAME_TESSELLATION_POINT_SIZE:
		name_str = "tessellation_point_size";
		break;
	case EXTENSIONNAME_TEXTURE_BUFFER:
		name_str = "texture_buffer";
		break;
	case EXTENSIONNAME_TEXTURE_CUBE_MAP_ARRAY:
		name_str = "texture_cube_map_array";
		break;
	case EXTENSIONNAME_GPU_SHADER5:
		name_str = "gpu_shader5";
		break;
	case EXTENSIONNAME_VIEWPORT_ARRAY:
		name_str = "viewport_array";
		break;
	default:
		DE_ASSERT(0);
		return "#error unknown extension name\n";
	}

	switch (behavior)
	{
	case EXTENSIONBEHAVIOR_DISABLE:
		behavior_str = "disable";
		break;
	case EXTENSIONBEHAVIOR_WARN:
		behavior_str = "warn";
		break;
	case EXTENSIONBEHAVIOR_ENABLE:
		behavior_str = "enable";
		break;
	case EXTENSIONBEHAVIOR_REQUIRE:
		behavior_str = "require";
		break;
	default:
		DE_ASSERT(0);
		return "#error unknown extension behavior";
	}

	std::stringstream str;
	str << "#extension GL_" << type_str << name_str << " : " << behavior_str;
	return str.str();
}